

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
cfgfile::parser_t<cfgfile::string_trait_t>::parser_t
          (parser_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *tag,
          input_stream_t<cfgfile::string_trait_t> *stream)

{
  pos_t pVar1;
  _Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_false> _Var2;
  
  _Var2._M_head_impl = (parser_base_t<cfgfile::string_trait_t> *)operator_new(0x78);
  (_Var2._M_head_impl)->_vptr_parser_base_t = (_func_int **)&PTR__parser_base_t_00164698;
  (_Var2._M_head_impl)->m_tag = tag;
  *(undefined8 *)&((_Var2._M_head_impl)->m_stack).c = 0;
  *(size_t *)((long)&(_Var2._M_head_impl)->m_stack + 8) = 0;
  ((iterator *)((long)&(_Var2._M_head_impl)->m_stack + 0x10))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(_Var2._M_head_impl)->m_stack + 0x18) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(_Var2._M_head_impl)->m_stack + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)((long)&(_Var2._M_head_impl)->m_stack + 0x28) = (_Map_pointer)0x0;
  ((iterator *)((long)&(_Var2._M_head_impl)->m_stack + 0x30))->_M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(_Var2._M_head_impl)->m_stack + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(_Var2._M_head_impl)->m_stack + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)((long)&(_Var2._M_head_impl)->m_stack + 0x48) = (_Map_pointer)0x0;
  std::
  _Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::_M_initialize_map((_Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       *)&(_Var2._M_head_impl)->m_stack,0);
  (_Var2._M_head_impl)->_vptr_parser_base_t = (_func_int **)&PTR__parser_base_t_00164648;
  _Var2._M_head_impl[1]._vptr_parser_base_t = (_func_int **)stream;
  pVar1 = stream->m_column_number;
  *(tag_t<cfgfile::string_trait_t> **)((long)(_Var2._M_head_impl + 1) + 8) =
       (tag_t<cfgfile::string_trait_t> *)stream->m_line_number;
  *(pos_t *)&((stack<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
               *)((long)(_Var2._M_head_impl + 1) + 0x10))->c = pVar1;
  (this->m_d)._M_t.
  super___uniq_ptr_impl<cfgfile::details::parser_base_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_base_t<cfgfile::string_trait_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_std::default_delete<cfgfile::details::parser_base_t<cfgfile::string_trait_t>_>_>
  .super__Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  return;
}

Assistant:

parser_t( tag_t< Trait > & tag, input_stream_t< Trait > & stream )
		:	m_d( std::make_unique< details::parser_conffile_impl_t< Trait > >
				( tag, stream ) )
	{
	}